

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator.cpp
# Opt level: O3

void __thiscall
helics::Translator::Translator
          (Translator *this,Core *core,string_view translatorName,InterfaceHandle ihandle)

{
  (this->super_Interface)._vptr_Interface = (_func_int **)&PTR__Interface_0054a6e0;
  (this->super_Interface).mCore = core;
  (this->super_Interface).handle.hid = ihandle.hid;
  (this->super_Interface).mName._M_dataplus._M_p = (pointer)&(this->super_Interface).mName.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->super_Interface).mName,translatorName._M_str,
             translatorName._M_str + translatorName._M_len);
  (this->super_Interface)._vptr_Interface = (_func_int **)&PTR__Translator_0054c198;
  this->disableAssign = false;
  (this->transOp).super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->transOp).super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

Translator::Translator(Core* core, std::string_view translatorName, InterfaceHandle ihandle):
    Interface(core, ihandle, translatorName)
{
}